

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O0

int VmIntPow(int power,int number)

{
  undefined4 local_20;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  int result;
  int number_local;
  int power_local;
  
  if (power < 0) {
    if (number == 1) {
      local_1c = 1;
    }
    else {
      if (number == -1) {
        local_20 = 1;
        if ((power & 1U) != 0) {
          local_20 = -1;
        }
      }
      else {
        local_20 = 0;
      }
      local_1c = local_20;
    }
    number_local = local_1c;
  }
  else {
    local_18 = 1;
    local_14 = number;
    for (result = power; result != 0; result = result >> 1) {
      if ((result & 1U) != 0) {
        local_18 = local_14 * local_18;
        result = result + -1;
      }
      local_14 = local_14 * local_14;
    }
    number_local = local_18;
  }
  return number_local;
}

Assistant:

int VmIntPow(int power, int number)
{
	if(power < 0)
		return number == 1 ? 1 : (number == -1 ? ((power & 1) ? -1 : 1) : 0);

	int result = 1;
	while(power)
	{
		if(power & 1)
		{
			result *= number;
			power--;
		}
		number *= number;
		power >>= 1;
	}
	return result;
}